

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# player-attack.c
# Opt level: O0

wchar_t o_melee_damage(player *p,monster *mon,object *obj,wchar_t b,wchar_t s,uint32_t *msg_type)

{
  element_info eVar1;
  uint32_t uVar2;
  wchar_t wVar3;
  int iVar4;
  wchar_t local_64;
  wchar_t local_60;
  uint local_58;
  wchar_t local_54;
  uint local_4c;
  wchar_t bmult;
  wchar_t die_average;
  _Bool extra;
  wchar_t add;
  wchar_t dmg;
  wchar_t deadliness;
  wchar_t sides;
  wchar_t dice;
  uint32_t *msg_type_local;
  wchar_t s_local;
  wchar_t b_local;
  object *obj_local;
  monster *mon_local;
  player *p_local;
  
  if (obj == (object *)0x0) {
    local_54 = L'\x01';
  }
  else {
    local_54 = (wchar_t)obj->dd;
  }
  deadliness = local_54;
  die_average = L'\0';
  if (obj == (object *)0x0) {
    local_58 = 1;
  }
  else {
    local_58 = (uint)obj->ds;
  }
  local_4c = ((local_58 + 1) * 10) / 2;
  _sides = msg_type;
  msg_type_local._0_4_ = s;
  msg_type_local._4_4_ = b;
  _s_local = obj;
  obj_local = (object *)mon;
  mon_local = (monster *)p;
  if (s == L'\0') {
    if (b == L'\0') {
      local_4c = local_4c * 10;
    }
    else {
      wVar3 = get_monster_brand_multiplier(mon,brands + b,true);
      local_4c = wVar3 * local_4c;
      die_average = wVar3 + L'\xfffffff6';
    }
  }
  else {
    local_4c = slays[s].o_multiplier * local_4c;
    die_average = slays[s].o_multiplier + L'\xfffffff6';
  }
  eVar1 = mon_local[1].known_pstate.el_info[9];
  if (_s_local == (object *)0x0) {
    local_60 = L'\0';
  }
  else {
    local_60 = object_to_dam(_s_local);
  }
  add = (int)eVar1 + local_60;
  local_64 = add;
  if (L'\x96' < add) {
    local_64 = L'\x96';
  }
  apply_deadliness((int *)&local_4c,local_64);
  dmg = local_4c * 2 + L'\xffffd8f0';
  uVar2 = Rand_div(10000);
  bmult._3_1_ = (int)uVar2 < dmg % 10000;
  dmg = (uint)(byte)bmult._3_1_ + dmg / 10000;
  if (_s_local != (object *)0x0) {
    wVar3 = o_critical_melee((player *)mon_local,(monster *)obj_local,_s_local,_sides);
    deadliness = wVar3 + deadliness;
  }
  iVar4 = damroll(deadliness,dmg);
  return die_average + iVar4;
}

Assistant:

static int o_melee_damage(struct player *p, const struct monster *mon,
		struct object *obj, int b, int s, uint32_t *msg_type)
{
	int dice = (obj) ? obj->dd : 1;
	int sides, deadliness, dmg, add = 0;
	bool extra;

	/* Get the average value of a single damage die. (x10) */
	int die_average = (10 * (((obj) ? obj->ds : 1) + 1)) / 2;

	/* Adjust the average for slays and brands. (10x inflation) */
	if (s) {
		die_average *= slays[s].o_multiplier;
		add = slays[s].o_multiplier - 10;
	} else if (b) {
		int bmult = get_monster_brand_multiplier(mon, &brands[b], true);

		die_average *= bmult;
		add = bmult - 10;
	} else {
		die_average *= 10;
	}

	/* Apply deadliness to average. (100x inflation) */
	deadliness = p->state.to_d + ((obj) ? object_to_dam(obj) : 0);
	apply_deadliness(&die_average, MIN(deadliness, 150));

	/* Calculate the actual number of sides to each die. */
	sides = (2 * die_average) - 10000;
	extra = randint0(10000) < (sides % 10000);
	sides /= 10000;
	sides += (extra ? 1 : 0);

	/*
	 * Get number of critical dice; for now, excluding criticals for
	 * unarmed combat
	 */
	if (obj) dice += o_critical_melee(p, mon, obj, msg_type);

	/* Roll out the damage. */
	dmg = damroll(dice, sides);

	/* Apply any special additions to damage. */
	dmg += add;

	return dmg;
}